

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_2,bool polish)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  char cVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  type_conflict5 tVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  long lVar6;
  long lVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  cpp_dec_float<200u,int,void> *pcVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  DataKey DVar15;
  byte bVar16;
  ulong uVar17;
  int nr;
  DataKey local_a68;
  uint local_a60;
  uint local_a5c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a58;
  longlong local_a50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9c0;
  cpp_dec_float<200U,_int,_void> local_9b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta;
  cpp_dec_float<200U,_int,_void> local_8b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sel;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  
  bVar16 = 0;
  local_a60 = (uint)CONCAT71(in_register_00000009,polish);
  local_a68.info = 0;
  local_a68.idx = -1;
  local_a48.m_backend.fpclass = cpp_dec_float_finite;
  local_a48.m_backend.prec_elem = 0x1c;
  local_a48.m_backend.data._M_elems[0] = 0;
  local_a48.m_backend.data._M_elems[1] = 0;
  local_a48.m_backend.data._M_elems[2] = 0;
  local_a48.m_backend.data._M_elems[3] = 0;
  local_a48.m_backend.data._M_elems[4] = 0;
  local_a48.m_backend.data._M_elems[5] = 0;
  local_a48.m_backend.data._M_elems[6] = 0;
  local_a48.m_backend.data._M_elems[7] = 0;
  local_a48.m_backend.data._M_elems[8] = 0;
  local_a48.m_backend.data._M_elems[9] = 0;
  local_a48.m_backend.data._M_elems[10] = 0;
  local_a48.m_backend.data._M_elems[0xb] = 0;
  local_a48.m_backend.data._M_elems[0xc] = 0;
  local_a48.m_backend.data._M_elems[0xd] = 0;
  local_a48.m_backend.data._M_elems[0xe] = 0;
  local_a48.m_backend.data._M_elems[0xf] = 0;
  local_a48.m_backend.data._M_elems[0x10] = 0;
  local_a48.m_backend.data._M_elems[0x11] = 0;
  local_a48.m_backend.data._M_elems[0x12] = 0;
  local_a48.m_backend.data._M_elems[0x13] = 0;
  local_a48.m_backend.data._M_elems[0x18] = 0;
  local_a48.m_backend.data._M_elems[0x19] = 0;
  local_a48.m_backend.data._M_elems._104_5_ = 0;
  local_a48.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_a48.m_backend.exp = 0;
  local_a48.m_backend.neg = false;
  local_a48.m_backend.data._M_elems[0x14] = 0;
  local_a48.m_backend.data._M_elems[0x15] = 0;
  local_a48.m_backend.data._M_elems[0x16] = 0;
  local_a48.m_backend.data._M_elems[0x17] = 0;
  sel.m_backend.fpclass = cpp_dec_float_finite;
  sel.m_backend.prec_elem = 0x1c;
  sel.m_backend.data._M_elems[0] = 0;
  sel.m_backend.data._M_elems[1] = 0;
  sel.m_backend.data._M_elems[2] = 0;
  sel.m_backend.data._M_elems[3] = 0;
  sel.m_backend.data._M_elems[4] = 0;
  sel.m_backend.data._M_elems[5] = 0;
  sel.m_backend.data._M_elems[6] = 0;
  sel.m_backend.data._M_elems[7] = 0;
  sel.m_backend.data._M_elems[8] = 0;
  sel.m_backend.data._M_elems[9] = 0;
  sel.m_backend.data._M_elems[10] = 0;
  sel.m_backend.data._M_elems[0xb] = 0;
  sel.m_backend.data._M_elems[0xc] = 0;
  sel.m_backend.data._M_elems[0xd] = 0;
  sel.m_backend.data._M_elems[0xe] = 0;
  sel.m_backend.data._M_elems[0xf] = 0;
  sel.m_backend.data._M_elems[0x10] = 0;
  sel.m_backend.data._M_elems[0x11] = 0;
  sel.m_backend.data._M_elems[0x12] = 0;
  sel.m_backend.data._M_elems[0x13] = 0;
  sel.m_backend.data._M_elems[0x14] = 0;
  sel.m_backend.data._M_elems[0x15] = 0;
  sel.m_backend.data._M_elems[0x16] = 0;
  sel.m_backend.data._M_elems[0x17] = 0;
  sel.m_backend.data._M_elems[0x18] = 0;
  sel.m_backend.data._M_elems[0x19] = 0;
  sel.m_backend.data._M_elems._104_5_ = 0;
  sel.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  sel.m_backend.exp = 0;
  sel.m_backend.neg = false;
  local_a58 = val;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&maxabs.m_backend,0.0,(type *)0x0);
  psVar1 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&lowstab,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar17 = -(ulong)(*(double *)(lowstab.m_backend.data._M_elems._0_8_ + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&delta_shift.m_backend,
             (double)(~uVar17 & (ulong)(*(double *)(lowstab.m_backend.data._M_elems._0_8_ + 0x40) *
                                       1e-05) | uVar17 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lowstab.m_backend.data._M_elems + 2));
  resetTols(this);
  iVar5 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  cVar2 = *(char *)(CONCAT44(extraout_var,iVar5) + 0xa60);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&bestDelta,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar17 = -(ulong)(*(double *)(bestDelta.m_backend.data._M_elems._0_8_ + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&lowstab.m_backend,
             (double)(~uVar17 & (ulong)(*(double *)(bestDelta.m_backend.data._M_elems._0_8_ + 0x40)
                                       * 1e-10) | uVar17 & 0x3ddb7cdfd9d7bdbb),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(bestDelta.m_backend.data._M_elems + 2));
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&sel,0.0);
  pnVar12 = &this->epsilon;
  pnVar11 = pnVar12;
  pnVar14 = &bestDelta;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar14->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + (ulong)bVar16 * -8 + 4);
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar16 * -2 + 1) * 4);
  }
  bestDelta.m_backend.exp = (this->epsilon).m_backend.exp;
  bestDelta.m_backend.neg = (this->epsilon).m_backend.neg;
  bestDelta.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
  bestDelta.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
  tVar3 = boost::multiprecision::operator>(local_a58,&bestDelta);
  local_9c0 = pnVar12;
  if (tVar3) {
    iVar5 = 0;
    lVar6 = 0x1c;
    local_a5c = local_a60 & 0xff;
    do {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&maxabs,0.0);
      pnVar12 = local_a58;
      pnVar11 = &local_a48;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      local_a48.m_backend.exp = (local_a58->m_backend).exp;
      local_a48.m_backend.neg = (local_a58->m_backend).neg;
      local_a48.m_backend.fpclass = (local_a58->m_backend).fpclass;
      local_a48.m_backend.prec_elem = (local_a58->m_backend).prec_elem;
      local_a68 = (DataKey)maxDelta(this,&nr,&local_a48,&maxabs);
      DVar15 = local_a68;
      if (local_a68.info == 0) goto LAB_0044eb13;
      pnVar12 = &local_a48;
      pnVar11 = &local_130;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = local_a48.m_backend.exp;
      local_130.m_backend.neg = local_a48.m_backend.neg;
      local_130.m_backend.fpclass = local_a48.m_backend.fpclass;
      local_130.m_backend.prec_elem = local_a48.m_backend.prec_elem;
      pcVar9 = (cpp_dec_float<200u,int,void> *)&maxabs;
      pnVar12 = &local_1b0;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = *(uint *)pcVar9;
        pcVar9 = pcVar9 + (ulong)bVar16 * -8 + 4;
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = maxabs.m_backend.exp;
      local_1b0.m_backend.neg = maxabs.m_backend.neg;
      local_1b0.m_backend.fpclass = maxabs.m_backend.fpclass;
      local_1b0.m_backend.prec_elem = maxabs.m_backend.prec_elem;
      bVar4 = shortEnter(this,(SPxId *)&local_a68,nr,&local_130,&local_1b0);
      if (!bVar4) {
        bestDelta.m_backend.fpclass = cpp_dec_float_finite;
        bestDelta.m_backend.prec_elem = 0x1c;
        bestDelta.m_backend.data._M_elems[0] = 0;
        bestDelta.m_backend.data._M_elems[1] = 0;
        bestDelta.m_backend.data._M_elems[2] = 0;
        bestDelta.m_backend.data._M_elems[3] = 0;
        bestDelta.m_backend.data._M_elems[4] = 0;
        bestDelta.m_backend.data._M_elems[5] = 0;
        bestDelta.m_backend.data._M_elems[6] = 0;
        bestDelta.m_backend.data._M_elems[7] = 0;
        bestDelta.m_backend.data._M_elems[8] = 0;
        bestDelta.m_backend.data._M_elems[9] = 0;
        bestDelta.m_backend.data._M_elems[10] = 0;
        bestDelta.m_backend.data._M_elems[0xb] = 0;
        bestDelta.m_backend.data._M_elems[0xc] = 0;
        bestDelta.m_backend.data._M_elems[0xd] = 0;
        bestDelta.m_backend.data._M_elems[0xe] = 0;
        bestDelta.m_backend.data._M_elems[0xf] = 0;
        bestDelta.m_backend.data._M_elems[0x10] = 0;
        bestDelta.m_backend.data._M_elems[0x11] = 0;
        bestDelta.m_backend.data._M_elems[0x12] = 0;
        bestDelta.m_backend.data._M_elems[0x13] = 0;
        bestDelta.m_backend.data._M_elems[0x14] = 0;
        bestDelta.m_backend.data._M_elems[0x15] = 0;
        bestDelta.m_backend.data._M_elems[0x16] = 0;
        bestDelta.m_backend.data._M_elems[0x17] = 0;
        bestDelta.m_backend.data._M_elems[0x18] = 0;
        bestDelta.m_backend.data._M_elems[0x19] = 0;
        bestDelta.m_backend.data._M_elems._104_5_ = 0;
        bestDelta.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        bestDelta.m_backend.exp = 0;
        bestDelta.m_backend.neg = false;
        local_8b8.fpclass = cpp_dec_float_finite;
        local_8b8.prec_elem = 0x1c;
        local_8b8.data._M_elems[0] = 0;
        local_8b8.data._M_elems[1] = 0;
        local_8b8.data._M_elems[2] = 0;
        local_8b8.data._M_elems[3] = 0;
        local_8b8.data._M_elems[4] = 0;
        local_8b8.data._M_elems[5] = 0;
        local_8b8.data._M_elems[6] = 0;
        local_8b8.data._M_elems[7] = 0;
        local_8b8.data._M_elems[8] = 0;
        local_8b8.data._M_elems[9] = 0;
        local_8b8.data._M_elems[10] = 0;
        local_8b8.data._M_elems[0xb] = 0;
        local_8b8.data._M_elems[0xc] = 0;
        local_8b8.data._M_elems[0xd] = 0;
        local_8b8.data._M_elems[0xe] = 0;
        local_8b8.data._M_elems[0xf] = 0;
        local_8b8.data._M_elems[0x18] = 0;
        local_8b8.data._M_elems[0x19] = 0;
        local_8b8.data._M_elems._104_5_ = 0;
        local_8b8.data._M_elems[0x1b]._1_3_ = 0;
        local_8b8.exp = 0;
        local_8b8.neg = false;
        local_8b8.data._M_elems[0x10] = 0;
        local_8b8.data._M_elems[0x11] = 0;
        local_8b8.data._M_elems[0x12] = 0;
        local_8b8.data._M_elems[0x13] = 0;
        local_8b8.data._M_elems[0x14] = 0;
        local_8b8.data._M_elems[0x15] = 0;
        local_8b8.data._M_elems[0x16] = 0;
        local_8b8.data._M_elems[0x17] = 0;
        pcVar9 = (cpp_dec_float<200u,int,void> *)&maxabs;
        pnVar12 = &local_230;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = *(uint *)pcVar9;
          pcVar9 = pcVar9 + (ulong)bVar16 * -8 + 4;
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
        }
        local_230.m_backend.exp = maxabs.m_backend.exp;
        local_230.m_backend.neg = maxabs.m_backend.neg;
        local_230.m_backend.fpclass = maxabs.m_backend.fpclass;
        local_230.m_backend.prec_elem = maxabs.m_backend.prec_elem;
        minStability((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_9b8,this,&local_230);
        pcVar8 = &local_8b8;
        pcVar10 = &local_9b8;
        pcVar13 = pcVar8;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0] =
               (((cpp_dec_float<200U,_int,_void> *)&pcVar10->data)->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + ((ulong)bVar16 * -2 + 1) * 4)
          ;
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar16 * -2 + 1) * 4)
          ;
        }
        local_8b8.exp = local_9b8.exp;
        local_8b8.neg = local_9b8.neg;
        local_8b8.fpclass = local_9b8.fpclass;
        local_8b8.prec_elem = local_9b8.prec_elem;
        if (cVar2 == '\0') {
          pnVar12 = &local_330;
          pnVar11 = &local_a48;
          pnVar14 = pnVar12;
          for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          local_330.m_backend.exp = local_a48.m_backend.exp;
          local_330.m_backend.neg = local_a48.m_backend.neg;
          local_330.m_backend.fpclass = local_a48.m_backend.fpclass;
          local_330.m_backend.prec_elem = local_a48.m_backend.prec_elem;
        }
        else {
          pnVar12 = &local_2b0;
          pnVar11 = &local_a48;
          pnVar14 = pnVar12;
          for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          local_2b0.m_backend.exp = local_a48.m_backend.exp;
          local_2b0.m_backend.neg = local_a48.m_backend.neg;
          local_2b0.m_backend.fpclass = local_a48.m_backend.fpclass;
          local_2b0.m_backend.prec_elem = local_a48.m_backend.prec_elem;
          pcVar8 = &lowstab.m_backend;
        }
        local_a68 = (DataKey)maxSelect(this,&nr,&sel,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)pcVar8,&bestDelta,pnVar12);
        local_9b8.fpclass = cpp_dec_float_finite;
        local_9b8.prec_elem = 0x1c;
        local_9b8.data._M_elems[0] = 0;
        local_9b8.data._M_elems[1] = 0;
        local_9b8.data._M_elems[2] = 0;
        local_9b8.data._M_elems[3] = 0;
        local_9b8.data._M_elems[4] = 0;
        local_9b8.data._M_elems[5] = 0;
        local_9b8.data._M_elems[6] = 0;
        local_9b8.data._M_elems[7] = 0;
        local_9b8.data._M_elems[8] = 0;
        local_9b8.data._M_elems[9] = 0;
        local_9b8.data._M_elems[10] = 0;
        local_9b8.data._M_elems[0xb] = 0;
        local_9b8.data._M_elems[0xc] = 0;
        local_9b8.data._M_elems[0xd] = 0;
        local_9b8.data._M_elems[0xe] = 0;
        local_9b8.data._M_elems[0xf] = 0;
        local_9b8.data._M_elems[0x10] = 0;
        local_9b8.data._M_elems[0x11] = 0;
        local_9b8.data._M_elems[0x12] = 0;
        local_9b8.data._M_elems[0x13] = 0;
        local_9b8.data._M_elems[0x14] = 0;
        local_9b8.data._M_elems[0x15] = 0;
        local_9b8.data._M_elems[0x16] = 0;
        local_9b8.data._M_elems[0x17] = 0;
        local_9b8.data._M_elems[0x18] = 0;
        local_9b8.data._M_elems[0x19] = 0;
        local_9b8.data._M_elems._104_5_ = 0;
        local_9b8.data._M_elems[0x1b]._1_3_ = 0;
        local_9b8.exp = 0;
        local_9b8.neg = false;
        local_a50 = 2;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  (&local_9b8,&delta_shift.m_backend,&local_a50);
        tVar3 = boost::multiprecision::operator<
                          (&bestDelta,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_9b8);
        iVar5 = (iVar5 - (uint)tVar3) + 2;
      }
      pnVar12 = &maxabs;
      pnVar11 = &local_3b0;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      local_3b0.m_backend.exp = maxabs.m_backend.exp;
      local_3b0.m_backend.neg = maxabs.m_backend.neg;
      local_3b0.m_backend.fpclass = maxabs.m_backend.fpclass;
      local_3b0.m_backend.prec_elem = maxabs.m_backend.prec_elem;
      bVar4 = maxReEnter(this,&sel,&local_3b0,(SPxId *)&local_a68,nr,SUB41(local_a5c,0));
    } while ((bVar4) && (relax(this), iVar5 < 2));
  }
  else {
    pnVar11 = &bestDelta;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + (ulong)bVar16 * -8 + 4);
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
    }
    bestDelta.m_backend.exp = (this->epsilon).m_backend.exp;
    bestDelta.m_backend.neg = (this->epsilon).m_backend.neg;
    bestDelta.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
    bestDelta.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
    if (bestDelta.m_backend.fpclass != cpp_dec_float_finite ||
        bestDelta.m_backend.data._M_elems[0] != 0) {
      bestDelta.m_backend.neg = (bool)(bestDelta.m_backend.neg ^ 1);
    }
    tVar3 = boost::multiprecision::operator<(local_a58,&bestDelta);
    if (tVar3) {
      iVar5 = 0;
      lVar6 = 0x1c;
      local_a5c = local_a60 & 0xff;
      do {
        pcVar8 = &local_8b8;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&maxabs,0.0);
        pnVar12 = local_a58;
        pnVar11 = &local_a48;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
        }
        local_a48.m_backend.exp = (local_a58->m_backend).exp;
        local_a48.m_backend.neg = (local_a58->m_backend).neg;
        local_a48.m_backend.fpclass = (local_a58->m_backend).fpclass;
        local_a48.m_backend.prec_elem = (local_a58->m_backend).prec_elem;
        local_a68 = (DataKey)minDelta(this,&nr,&local_a48,&maxabs);
        DVar15 = local_a68;
        if (local_a68.info == 0) goto LAB_0044eb13;
        pnVar12 = &local_a48;
        pnVar11 = &local_430;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
        }
        local_430.m_backend.exp = local_a48.m_backend.exp;
        local_430.m_backend.neg = local_a48.m_backend.neg;
        local_430.m_backend.fpclass = local_a48.m_backend.fpclass;
        local_430.m_backend.prec_elem = local_a48.m_backend.prec_elem;
        pcVar9 = (cpp_dec_float<200u,int,void> *)&maxabs;
        pnVar12 = &local_4b0;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = *(uint *)pcVar9;
          pcVar9 = pcVar9 + (ulong)bVar16 * -8 + 4;
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
        }
        local_4b0.m_backend.exp = maxabs.m_backend.exp;
        local_4b0.m_backend.neg = maxabs.m_backend.neg;
        local_4b0.m_backend.fpclass = maxabs.m_backend.fpclass;
        local_4b0.m_backend.prec_elem = maxabs.m_backend.prec_elem;
        bVar4 = shortEnter(this,(SPxId *)&local_a68,nr,&local_430,&local_4b0);
        if (!bVar4) {
          bestDelta.m_backend.fpclass = cpp_dec_float_finite;
          bestDelta.m_backend.prec_elem = 0x1c;
          bestDelta.m_backend.data._M_elems[0] = 0;
          bestDelta.m_backend.data._M_elems[1] = 0;
          bestDelta.m_backend.data._M_elems[2] = 0;
          bestDelta.m_backend.data._M_elems[3] = 0;
          bestDelta.m_backend.data._M_elems[4] = 0;
          bestDelta.m_backend.data._M_elems[5] = 0;
          bestDelta.m_backend.data._M_elems[6] = 0;
          bestDelta.m_backend.data._M_elems[7] = 0;
          bestDelta.m_backend.data._M_elems[8] = 0;
          bestDelta.m_backend.data._M_elems[9] = 0;
          bestDelta.m_backend.data._M_elems[10] = 0;
          bestDelta.m_backend.data._M_elems[0xb] = 0;
          bestDelta.m_backend.data._M_elems[0xc] = 0;
          bestDelta.m_backend.data._M_elems[0xd] = 0;
          bestDelta.m_backend.data._M_elems[0xe] = 0;
          bestDelta.m_backend.data._M_elems[0xf] = 0;
          bestDelta.m_backend.data._M_elems[0x10] = 0;
          bestDelta.m_backend.data._M_elems[0x11] = 0;
          bestDelta.m_backend.data._M_elems[0x12] = 0;
          bestDelta.m_backend.data._M_elems[0x13] = 0;
          bestDelta.m_backend.data._M_elems[0x14] = 0;
          bestDelta.m_backend.data._M_elems[0x15] = 0;
          bestDelta.m_backend.data._M_elems[0x16] = 0;
          bestDelta.m_backend.data._M_elems[0x17] = 0;
          bestDelta.m_backend.data._M_elems[0x18] = 0;
          bestDelta.m_backend.data._M_elems[0x19] = 0;
          bestDelta.m_backend.data._M_elems._104_5_ = 0;
          bestDelta.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          bestDelta.m_backend.exp = 0;
          bestDelta.m_backend.neg = false;
          local_8b8.fpclass = cpp_dec_float_finite;
          local_8b8.prec_elem = 0x1c;
          local_8b8.data._M_elems[0] = 0;
          local_8b8.data._M_elems[1] = 0;
          local_8b8.data._M_elems[2] = 0;
          local_8b8.data._M_elems[3] = 0;
          local_8b8.data._M_elems[4] = 0;
          local_8b8.data._M_elems[5] = 0;
          local_8b8.data._M_elems[6] = 0;
          local_8b8.data._M_elems[7] = 0;
          local_8b8.data._M_elems[8] = 0;
          local_8b8.data._M_elems[9] = 0;
          local_8b8.data._M_elems[10] = 0;
          local_8b8.data._M_elems[0xb] = 0;
          local_8b8.data._M_elems[0xc] = 0;
          local_8b8.data._M_elems[0xd] = 0;
          local_8b8.data._M_elems[0xe] = 0;
          local_8b8.data._M_elems[0xf] = 0;
          local_8b8.data._M_elems[0x18] = 0;
          local_8b8.data._M_elems[0x19] = 0;
          local_8b8.data._M_elems._104_5_ = 0;
          local_8b8.data._M_elems[0x1b]._1_3_ = 0;
          local_8b8.exp = 0;
          local_8b8.neg = false;
          local_8b8.data._M_elems[0x10] = 0;
          local_8b8.data._M_elems[0x11] = 0;
          local_8b8.data._M_elems[0x12] = 0;
          local_8b8.data._M_elems[0x13] = 0;
          local_8b8.data._M_elems[0x14] = 0;
          local_8b8.data._M_elems[0x15] = 0;
          local_8b8.data._M_elems[0x16] = 0;
          local_8b8.data._M_elems[0x17] = 0;
          pcVar9 = (cpp_dec_float<200u,int,void> *)&maxabs;
          pnVar12 = &local_530;
          for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar12->m_backend).data._M_elems[0] = *(uint *)pcVar9;
            pcVar9 = pcVar9 + (ulong)bVar16 * -8 + 4;
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          local_530.m_backend.exp = maxabs.m_backend.exp;
          local_530.m_backend.neg = maxabs.m_backend.neg;
          local_530.m_backend.fpclass = maxabs.m_backend.fpclass;
          local_530.m_backend.prec_elem = maxabs.m_backend.prec_elem;
          minStability((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_9b8,this,&local_530);
          pcVar10 = &local_9b8;
          pcVar13 = pcVar8;
          for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
            (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar10->data)->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar10 + ((ulong)bVar16 * -2 + 1) * 4);
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          local_8b8.exp = local_9b8.exp;
          local_8b8.neg = local_9b8.neg;
          local_8b8.fpclass = local_9b8.fpclass;
          local_8b8.prec_elem = local_9b8.prec_elem;
          if (cVar2 == '\0') {
            pnVar12 = &local_630;
            pnVar11 = &local_a48;
            pnVar14 = pnVar12;
            for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
              pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar16 * -2 + 1) * 4);
            }
            local_630.m_backend.exp = local_a48.m_backend.exp;
            local_630.m_backend.neg = local_a48.m_backend.neg;
            local_630.m_backend.fpclass = local_a48.m_backend.fpclass;
            local_630.m_backend.prec_elem = local_a48.m_backend.prec_elem;
          }
          else {
            pnVar12 = &local_5b0;
            pnVar11 = &local_a48;
            pnVar14 = pnVar12;
            for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
              pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar16 * -2 + 1) * 4);
            }
            local_5b0.m_backend.exp = local_a48.m_backend.exp;
            local_5b0.m_backend.neg = local_a48.m_backend.neg;
            local_5b0.m_backend.fpclass = local_a48.m_backend.fpclass;
            local_5b0.m_backend.prec_elem = local_a48.m_backend.prec_elem;
            pcVar8 = &lowstab.m_backend;
          }
          local_a68 = (DataKey)minSelect(this,&nr,&sel,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)pcVar8,&bestDelta,pnVar12);
          local_9b8.fpclass = cpp_dec_float_finite;
          local_9b8.prec_elem = 0x1c;
          local_9b8.data._M_elems[0] = 0;
          local_9b8.data._M_elems[1] = 0;
          local_9b8.data._M_elems[2] = 0;
          local_9b8.data._M_elems[3] = 0;
          local_9b8.data._M_elems[4] = 0;
          local_9b8.data._M_elems[5] = 0;
          local_9b8.data._M_elems[6] = 0;
          local_9b8.data._M_elems[7] = 0;
          local_9b8.data._M_elems[8] = 0;
          local_9b8.data._M_elems[9] = 0;
          local_9b8.data._M_elems[10] = 0;
          local_9b8.data._M_elems[0xb] = 0;
          local_9b8.data._M_elems[0xc] = 0;
          local_9b8.data._M_elems[0xd] = 0;
          local_9b8.data._M_elems[0xe] = 0;
          local_9b8.data._M_elems[0xf] = 0;
          local_9b8.data._M_elems[0x10] = 0;
          local_9b8.data._M_elems[0x11] = 0;
          local_9b8.data._M_elems[0x12] = 0;
          local_9b8.data._M_elems[0x13] = 0;
          local_9b8.data._M_elems[0x14] = 0;
          local_9b8.data._M_elems[0x15] = 0;
          local_9b8.data._M_elems[0x16] = 0;
          local_9b8.data._M_elems[0x17] = 0;
          local_9b8.data._M_elems[0x18] = 0;
          local_9b8.data._M_elems[0x19] = 0;
          local_9b8.data._M_elems._104_5_ = 0;
          local_9b8.data._M_elems[0x1b]._1_3_ = 0;
          local_9b8.exp = 0;
          local_9b8.neg = false;
          local_a50 = 2;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                    (&local_9b8,&delta_shift.m_backend,&local_a50);
          tVar3 = boost::multiprecision::operator<
                            (&bestDelta,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_9b8);
          iVar5 = (iVar5 - (uint)tVar3) + 2;
        }
        pnVar12 = &maxabs;
        pnVar11 = &local_6b0;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
        }
        local_6b0.m_backend.exp = maxabs.m_backend.exp;
        local_6b0.m_backend.neg = maxabs.m_backend.neg;
        local_6b0.m_backend.fpclass = maxabs.m_backend.fpclass;
        local_6b0.m_backend.prec_elem = maxabs.m_backend.prec_elem;
        bVar4 = minReEnter(this,&sel,&local_6b0,(SPxId *)&local_a68,nr,SUB41(local_a5c,0));
      } while ((bVar4) && (relax(this), iVar5 < 2));
    }
  }
  DVar15.info = 0;
  DVar15.idx = -1;
  if ((char)local_a60 == '\0') {
LAB_0044ea05:
    if (local_a68.info == 0) goto LAB_0044ea13;
    bVar4 = false;
LAB_0044ead1:
    pnVar12 = &sel;
    pnVar11 = local_a58;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
    }
    (local_a58->m_backend).exp = sel.m_backend.exp;
    (local_a58->m_backend).neg = sel.m_backend.neg;
    (local_a58->m_backend).fpclass = sel.m_backend.fpclass;
    (local_a58->m_backend).prec_elem = sel.m_backend.prec_elem;
    if (!bVar4) {
      tighten(this);
    }
  }
  else {
    if (local_a68.info != 0) {
      this_00 = (this->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
      if (this_00->polishObj == POLISH_FRACTIONALITY) {
        if ((this_00->integerVariables).thesize ==
            (this_00->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
          if ((0 < local_a68.info) &&
             (iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::number(&this_00->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ,(SPxId *)&local_a68), (this_00->integerVariables).data[iVar5] == 1))
          {
LAB_0044eb32:
            local_a68.info = 0;
            local_a68.idx = 0;
            goto LAB_0044eb13;
          }
        }
        else if (0 < local_a68.info) goto LAB_0044eb32;
      }
      else if ((this_00->polishObj == POLISH_INTEGRALITY) &&
              ((local_a68.info < 0 ||
               (((this_00->integerVariables).thesize ==
                 (this_00->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum &&
                (iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::number(&this_00->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ,(SPxId *)&local_a68),
                (this_00->integerVariables).data[iVar5] == 0)))))) goto LAB_0044eb32;
      goto LAB_0044ea05;
    }
LAB_0044ea13:
    pnVar12 = local_9c0;
    pcVar8 = &local_8b8;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pcVar8->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + (ulong)bVar16 * -8 + 4);
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar16 * -8 + 4);
    }
    local_8b8.exp = (this->epsilon).m_backend.exp;
    local_8b8.neg = (this->epsilon).m_backend.neg;
    local_8b8.fpclass = (this->epsilon).m_backend.fpclass;
    local_8b8.prec_elem = (this->epsilon).m_backend.prec_elem;
    bestDelta.m_backend.fpclass = cpp_dec_float_finite;
    bestDelta.m_backend.prec_elem = 0x1c;
    bestDelta.m_backend.data._M_elems[0] = 0;
    bestDelta.m_backend.data._M_elems[1] = 0;
    bestDelta.m_backend.data._M_elems[2] = 0;
    bestDelta.m_backend.data._M_elems[3] = 0;
    bestDelta.m_backend.data._M_elems[4] = 0;
    bestDelta.m_backend.data._M_elems[5] = 0;
    bestDelta.m_backend.data._M_elems[6] = 0;
    bestDelta.m_backend.data._M_elems[7] = 0;
    bestDelta.m_backend.data._M_elems[8] = 0;
    bestDelta.m_backend.data._M_elems[9] = 0;
    bestDelta.m_backend.data._M_elems[10] = 0;
    bestDelta.m_backend.data._M_elems[0xb] = 0;
    bestDelta.m_backend.data._M_elems[0xc] = 0;
    bestDelta.m_backend.data._M_elems[0xd] = 0;
    bestDelta.m_backend.data._M_elems[0xe] = 0;
    bestDelta.m_backend.data._M_elems[0xf] = 0;
    bestDelta.m_backend.data._M_elems[0x18] = 0;
    bestDelta.m_backend.data._M_elems[0x19] = 0;
    bestDelta.m_backend.data._M_elems._104_5_ = 0;
    bestDelta.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    bestDelta.m_backend.exp = 0;
    bestDelta.m_backend.neg = false;
    bestDelta.m_backend.data._M_elems[0x10] = 0;
    bestDelta.m_backend.data._M_elems[0x11] = 0;
    bestDelta.m_backend.data._M_elems[0x12] = 0;
    bestDelta.m_backend.data._M_elems[0x13] = 0;
    bestDelta.m_backend.data._M_elems[0x14] = 0;
    bestDelta.m_backend.data._M_elems[0x15] = 0;
    bestDelta.m_backend.data._M_elems[0x16] = 0;
    bestDelta.m_backend.data._M_elems[0x17] = 0;
    local_9b8.data._M_elems[0] = 2;
    local_9b8.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
              (&bestDelta.m_backend,&local_8b8,(longlong *)&local_9b8);
    tVar3 = boost::multiprecision::operator>
                      (&this->minStab,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&bestDelta.m_backend);
    if (tVar3) {
      bVar4 = local_a68.info == 0;
      goto LAB_0044ead1;
    }
  }
  DVar15 = (DataKey)((ulong)local_a68 & 0xffffffff00000000);
LAB_0044eb13:
  return (SPxId)((ulong)local_a68 & 0xffffffff | DVar15);
}

Assistant:

SPxId SPxFastRT<R>::selectEnter(R& val, int, bool polish)
{
   SPxId enterId;
   R max, sel;
   R maxabs = 0.0;
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   int nr;
   int cnt = 0;

   assert(this->m_type == SPxSolverBase<R>::LEAVE);

   resetTols();

   // force instable pivot iff true (see explanation in leave.hpp and spxsolve.hpp)
   bool instable = this->solver()->instableLeave;
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   assert(!instable || this->solver()->instableLeaveNum >= 0);

   sel = 0.0;

   if(val > epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;

         enterId = maxDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max >= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = maxSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = maxSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!maxReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else if(val < -epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;
         enterId = minDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max <= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = minSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = minSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!minReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }

   SPX_DEBUG(

      if(enterId.isValid())
{
   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

      R x;

      if(this->thesolver->isCoId(enterId))
         x = this->thesolver->coPvec().delta()[ this->thesolver->number(enterId) ];
      else
         x = this->thesolver->pVec().delta()[ this->thesolver->number(enterId) ];

      std::cout << "DFSTRT03 " << this->thesolver->basis().iteration() << ": "
                << sel << '\t' << x << " (" << maxabs << ")" << std::endl;
   }
   else
      std::cout << "DFSTRT04 " << this->thesolver->basis().iteration()
                << ": skipping instable pivot" << std::endl;
      )

      if(polish && enterId.isValid())
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);

         // decide whether the chosen entering index contributes to the polishing objective
         if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_INTEGRALITY)
         {
            // only allow (integer) variables to enter the basis
            if(enterId.isSPxRowId())
               return SPxId();
            else if(this->thesolver->integerVariables.size() == this->thesolver->nCols()
                    && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 0)
               return SPxId();
         }
         else if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_FRACTIONALITY)
         {
            // only allow slacks and continuous variables to enter the basis
            if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
            {
               if(enterId.isSPxColId() && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 1)
                  return SPxId();
            }
            else if(enterId.isSPxColId())
               return SPxId();
         }
      }


   if(enterId.isValid() || minStab > 2 * epsilonZero())
   {
      val = sel;

      if(enterId.isValid())
         tighten();
   }

   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

   return enterId;
}